

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_0::CWriter::WriteCSource(CWriter *this)

{
  pointer *ppLVar1;
  _Rb_tree_header *p_Var2;
  ExprType EVar3;
  Enum EVar4;
  ExternalKind EVar5;
  pointer ppTVar6;
  TypeEntry *base;
  pointer ppTVar7;
  Tag *pTVar8;
  Type type;
  pointer ppFVar9;
  pointer ppGVar10;
  Global *pGVar11;
  OpenBrace *pOVar12;
  byte *pbVar13;
  byte *pbVar14;
  Memory *pMVar15;
  pointer ppDVar16;
  DataSegment *pDVar17;
  pointer puVar18;
  pointer puVar19;
  char (*args) [10];
  intrusive_list<wabt::Expr> *piVar20;
  pointer ppEVar21;
  ElemSegment *pEVar22;
  pointer args_00;
  char (*pacVar23) [3];
  pointer pTVar24;
  pointer ppVar25;
  pointer ppVar26;
  pointer ppIVar27;
  Import *pIVar28;
  pointer ppVVar29;
  Var *var;
  pointer ppTVar30;
  pointer ppMVar31;
  pointer pTVar32;
  pointer pTVar33;
  _Alloc_hider _Var34;
  size_type sVar35;
  byte bVar36;
  Index IVar37;
  size_t sVar38;
  FuncType *pFVar39;
  iterator iVar40;
  const_reference base_00;
  VarExpr<(wabt::ExprType)36> *pVVar41;
  Func *pFVar42;
  size_type sVar43;
  Table *pTVar44;
  char *pcVar45;
  size_type sVar46;
  Module *pMVar47;
  pointer ppTVar48;
  OpenBrace *pOVar49;
  pointer ppMVar50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar51;
  OpenBrace *pOVar52;
  pointer ppTVar53;
  Newline *in_RDX;
  TypeVector *extraout_RDX;
  Newline *extraout_RDX_00;
  Newline *extraout_RDX_01;
  TypeVector *extraout_RDX_02;
  OpenBrace *u;
  TypeVector *extraout_RDX_03;
  TypeVector *pTVar54;
  Newline *u_00;
  Newline *u_01;
  Newline *u_02;
  char (*u_03) [6];
  char (*pacVar55) [2];
  char (*extraout_RDX_04) [2];
  Newline *pNVar56;
  Newline *u_04;
  Newline *extraout_RDX_05;
  Newline *extraout_RDX_06;
  Newline *extraout_RDX_07;
  Newline *extraout_RDX_08;
  Newline *extraout_RDX_09;
  char (*u_05) [6];
  char (*extraout_RDX_10) [2];
  Newline *u_06;
  Newline *extraout_RDX_11;
  char (*extraout_RDX_12) [2];
  Newline *extraout_RDX_13;
  char (*extraout_RDX_14) [2];
  Newline *u_07;
  Newline *extraout_RDX_15;
  Newline *extraout_RDX_16;
  Newline *extraout_RDX_17;
  OpenBrace *u_08;
  char (*extraout_RDX_18) [2];
  char (*extraout_RDX_19) [2];
  Newline *u_09;
  char (*extraout_RDX_20) [2];
  Newline *u_10;
  Newline *u_11;
  char (*extraout_RDX_21) [2];
  Newline *u_12;
  char (*extraout_RDX_22) [2];
  Newline *extraout_RDX_23;
  char (*u_13) [2];
  Newline *extraout_RDX_24;
  Newline *u_14;
  char (*extraout_RDX_25) [2];
  Newline *u_15;
  char (*extraout_RDX_26) [2];
  char (*u_16) [11];
  undefined8 extraout_RDX_27;
  undefined8 extraout_RDX_28;
  Newline *u_17;
  Newline *u_18;
  Newline *extraout_RDX_29;
  undefined8 extraout_RDX_30;
  Newline *u_19;
  Newline *extraout_RDX_31;
  undefined8 extraout_RDX_32;
  Newline *extraout_RDX_33;
  Newline *extraout_RDX_34;
  Newline *extraout_RDX_35;
  Newline *extraout_RDX_36;
  Newline *extraout_RDX_37;
  Newline *extraout_RDX_38;
  Newline *extraout_RDX_39;
  Newline *extraout_RDX_40;
  Newline *u_20;
  Newline *extraout_RDX_41;
  Newline *u_21;
  Newline *extraout_RDX_42;
  Newline *u_22;
  OpenBrace *extraout_RDX_43;
  OpenBrace *extraout_RDX_44;
  OpenBrace *extraout_RDX_45;
  Newline *u_23;
  Newline *u_24;
  Newline *u_25;
  Newline *u_26;
  Newline *u_27;
  Newline *u_28;
  uint uVar57;
  Type *t;
  pointer ppTVar58;
  ulong uVar59;
  pointer ppFVar60;
  pointer ppGVar61;
  Newline *pNVar62;
  pointer ppDVar63;
  pointer ppEVar64;
  pointer ppIVar65;
  pointer ppVVar66;
  pointer pTVar67;
  uint uVar68;
  int iVar69;
  char (*in_RSI) [40];
  FuncDeclaration *decl;
  ExprList *expr_list;
  char *pcVar70;
  CloseBrace *pCVar71;
  string *psVar72;
  GlobalName *in_R8;
  OpenBrace *in_R9;
  type *condition;
  size_type sVar73;
  FuncSignature *this_00;
  byte *pbVar74;
  intrusive_list<wabt::Expr> *this_01;
  _Rb_tree_node_base *p_Var75;
  pointer __x;
  long lVar76;
  ulong uVar77;
  pointer ppVar78;
  bool bVar79;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  string_view name_03;
  string_view name_04;
  string_view module_name;
  string_view module_name_00;
  string_view module_name_01;
  string_view module_name_02;
  string_view export_name;
  string_view export_name_00;
  size_t sStack_150;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  type_hash;
  string serialized_type;
  string name;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>_>_>
  *__range2;
  Type local_type;
  
  this->stream_ = this->c_stream_;
  (anonymous_namespace)::CWriter::Write<char_const(&)[40],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,in_RSI,in_RDX);
  pcVar70 = s_source_includes;
  sVar38 = strlen(s_source_includes);
  WriteData(this,pcVar70,sVar38);
  Write(this);
  WriteData(this,"#include \"",10);
  WriteData(this,(this->header_name_)._M_dataplus._M_p,(this->header_name_)._M_string_length);
  WriteData(this,"\"",1);
  Write(this);
  pcVar70 = s_source_declarations;
  sVar38 = strlen(s_source_declarations);
  WriteData(this,pcVar70,sVar38);
  pMVar47 = this->module_;
  pTVar54 = extraout_RDX;
  if ((pMVar47->types).super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pMVar47->types).super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    Write(this);
    type_hash._M_h._M_buckets = &type_hash._M_h._M_single_bucket;
    type_hash._M_h._M_bucket_count = 1;
    type_hash._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    type_hash._M_h._M_element_count = 0;
    type_hash._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    serialized_type._M_dataplus._M_p = (pointer)&serialized_type.field_2;
    serialized_type._M_string_length = 0;
    type_hash._M_h._M_rehash_policy._M_next_resize = 0;
    type_hash._M_h._M_single_bucket = (__node_base_ptr)0x0;
    serialized_type.field_2._M_allocated_capacity =
         serialized_type.field_2._M_allocated_capacity & 0xffffffffffffff00;
    ppTVar58 = (this->module_->types).
               super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppTVar6 = (this->module_->types).
              super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    while( true ) {
      if (ppTVar58 == ppTVar6) break;
      base = *ppTVar58;
      in_R8 = (GlobalName *)(base->name)._M_dataplus._M_p;
      name_00._M_str = (char *)in_R8;
      name_00._M_len = (base->name)._M_string_length;
      (anonymous_namespace)::CWriter::DefineGlobalScopeName_abi_cxx11_
                (&name,(CWriter *)this,Type,name_00);
      pFVar39 = cast<wabt::FuncType,wabt::TypeEntry>(base);
      SerializeFuncType(pFVar39,&serialized_type);
      iVar40 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find(&type_hash._M_h,&serialized_type);
      if (iVar40.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->unique_func_type_names_,&name);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::__cxx11::string&,std::__cxx11::string_const&>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&type_hash._M_h,&serialized_type,&name);
        WriteData(this,"FUNC_TYPE_T(",0xc);
        WriteData(this,(char *)CONCAT44(name._M_dataplus._M_p._4_4_,(Enum)name._M_dataplus._M_p),
                  CONCAT44(name._M_string_length._4_4_,(undefined4)name._M_string_length));
        WriteData(this,") = \"",5);
        sVar35 = serialized_type._M_string_length;
        _Var34 = serialized_type._M_dataplus;
        pNVar56 = extraout_RDX_00;
        for (sVar73 = 0; sVar35 != sVar73; sVar73 = sVar73 + 1) {
          Writef(this,"\\x%02x",(ulong)(byte)_Var34._M_p[sVar73]);
          pNVar56 = extraout_RDX_01;
        }
        (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [3])"\";",pNVar56);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->unique_func_type_names_,
                    (value_type *)
                    ((long)iVar40.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                           ._M_cur + 0x28));
      }
      std::__cxx11::string::_M_dispose();
      ppTVar58 = ppTVar58 + 1;
    }
    std::__cxx11::string::_M_dispose();
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&type_hash._M_h);
    pMVar47 = this->module_;
    pTVar54 = extraout_RDX_02;
  }
  ppTVar7 = (pMVar47->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppTVar48 = (pMVar47->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppTVar48 != ppTVar7;
      ppTVar48 = ppTVar48 + 1) {
    pTVar8 = *ppTVar48;
    uVar59 = (long)(pTVar8->decl).sig.param_types.
                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pTVar8->decl).sig.param_types.
                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if ((uVar59 & 0x7fffffff0) != 0) {
      this_00 = &(pTVar8->decl).sig;
      (anonymous_namespace)::CWriter::MangleTagTypes_abi_cxx11_
                ((string *)&type_hash,(CWriter *)this_00,pTVar54);
      WriteData(this,"#ifndef ",8);
      WriteData(this,(char *)type_hash._M_h._M_buckets,type_hash._M_h._M_bucket_count);
      Write(this);
      WriteData(this,"#define ",8);
      WriteData(this,(char *)type_hash._M_h._M_buckets,type_hash._M_h._M_bucket_count);
      WriteData(this," ",1);
      WriteData(this,(char *)type_hash._M_h._M_buckets,type_hash._M_h._M_bucket_count);
      Write(this);
      WriteData(this,"struct ",7);
      WriteData(this,(char *)type_hash._M_h._M_buckets,type_hash._M_h._M_bucket_count);
      (anonymous_namespace)::CWriter::Write<char_const(&)[2],wabt::(anonymous_namespace)::OpenBrace>
                ((CWriter *)this,(char (*) [2])0x161603,u);
      for (uVar77 = 0; (uVar59 >> 3 & 0xffffffff) != uVar77; uVar77 = uVar77 + 1) {
        type = *(Type *)((long)(this_00->param_types).
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_start + uVar77 * 8);
        Write(this,type);
        bVar36 = MangleType(type);
        Writef(this," %c%d;",(ulong)bVar36,uVar77 & 0xffffffff);
        Write(this);
      }
      Write(this);
      WriteData(this,";",1);
      Write(this);
      WriteData(this,"#endif  /* ",0xb);
      WriteData(this,(char *)type_hash._M_h._M_buckets,type_hash._M_h._M_bucket_count);
      WriteData(this," */",3);
      Write(this);
      std::__cxx11::string::_M_dispose();
      pTVar54 = extraout_RDX_03;
    }
  }
  ppTVar7 = (this->module_->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  uVar68 = 0;
  for (ppTVar48 = (this->module_->tags).
                  super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppTVar48 != ppTVar7; ppTVar48 = ppTVar48 + 1) {
    uVar57 = this->module_->num_tag_imports;
    if (uVar57 <= uVar68) {
      pTVar8 = *ppTVar48;
      if (uVar68 == uVar57) {
        Write(this);
        WriteData(this,"typedef char wasm_tag_placeholder_t;",0x24);
        Write(this);
      }
      in_R8 = (GlobalName *)(pTVar8->name)._M_dataplus._M_p;
      name_01._M_str = (char *)in_R8;
      name_01._M_len = (pTVar8->name)._M_string_length;
      (anonymous_namespace)::CWriter::DefineGlobalScopeName_abi_cxx11_
                ((string *)&type_hash,(CWriter *)this,Tag,name_01);
      WriteData(this,"static const wasm_tag_placeholder_t ",0x24);
      pacVar55 = (char (*) [2])type_hash._M_h._M_buckets;
      WriteData(this,(char *)type_hash._M_h._M_buckets,type_hash._M_h._M_bucket_count);
      (anonymous_namespace)::CWriter::Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,pacVar55,u_00);
      std::__cxx11::string::_M_dispose();
    }
    uVar68 = uVar68 + 1;
  }
  pMVar47 = this->module_;
  if ((long)(pMVar47->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)(pMVar47->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl
            .super__Vector_impl_data._M_start >> 3 != (ulong)pMVar47->num_func_imports) {
    Write(this);
    ppFVar9 = (this->module_->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    uVar68 = 0;
    for (ppFVar60 = (this->module_->funcs).
                    super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
                    super__Vector_impl_data._M_start; pMVar47 = this->module_, ppFVar60 != ppFVar9;
        ppFVar60 = ppFVar60 + 1) {
      if (pMVar47->num_func_imports <= uVar68) {
        pFVar42 = *ppFVar60;
        WriteData(this,"static ",7);
        decl = &pFVar42->decl;
        in_R8 = (GlobalName *)(pFVar42->name)._M_dataplus._M_p;
        name_02._M_str = (char *)in_R8;
        name_02._M_len = (pFVar42->name)._M_string_length;
        (anonymous_namespace)::CWriter::DefineGlobalScopeName_abi_cxx11_
                  ((string *)&type_hash,(CWriter *)this,Func,name_02);
        WriteFuncDeclaration(this,decl,(string *)&type_hash);
        std::__cxx11::string::_M_dispose();
        (anonymous_namespace)::CWriter::Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,&decl->has_func_type,u_01);
      }
      uVar68 = uVar68 + 1;
    }
  }
  pOVar49 = (OpenBrace *)
            (pMVar47->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (pOVar49 !=
      (OpenBrace *)
      (pMVar47->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
              ((string *)&type_hash,(CWriter *)this);
    Write(this);
    WriteData(this,"static void init_globals(",0x19);
    (anonymous_namespace)::CWriter::
    Write<std::__cxx11::string,char_const(&)[13],wabt::(anonymous_namespace)::OpenBrace>
              ((CWriter *)this,(string *)&type_hash,(char (*) [13])"* instance) ",pOVar49);
    std::__cxx11::string::_M_dispose();
    ppGVar10 = (this->module_->globals).
               super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    uVar68 = 0;
    for (ppGVar61 = (this->module_->globals).
                    super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppGVar61 != ppGVar10; ppGVar61 = ppGVar61 + 1)
    {
      if (this->module_->num_global_imports <= uVar68) {
        pGVar11 = *ppGVar61;
        if ((pGVar11->init_expr).size_ == 0) {
          __assert_fail("!global->init_expr.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                        ,0x69e,
                        "void wabt::(anonymous namespace)::CWriter::WriteGlobalInitializers()");
        }
        type_hash._M_h._M_buckets = (__buckets_ptr)CONCAT44(type_hash._M_h._M_buckets._4_4_,1);
        expr_list = &pGVar11->init_expr;
        type_hash._M_h._M_bucket_count = (size_type)pGVar11;
        Write(this,(ExternalInstanceRef *)&type_hash);
        WriteData(this," = ",3);
        WriteInitExpr(this,expr_list);
        (anonymous_namespace)::CWriter::Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [2])expr_list,u_02);
      }
      uVar68 = uVar68 + 1;
    }
    Write(this);
    Write(this);
    Write(this);
    pMVar47 = this->module_;
  }
  if ((pMVar47->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pMVar47->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pOVar12 = (OpenBrace *)
              (pMVar47->data_segments).
              super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pOVar49 = (OpenBrace *)
                   (pMVar47->data_segments).
                   super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; pOVar49 != pOVar12;
        pOVar49 = pOVar49 + 8) {
      lVar76 = *(long *)pOVar49;
      if (*(long *)(lVar76 + 0x88) != *(long *)(lVar76 + 0x90)) {
        type_hash._M_h._M_bucket_count = lVar76 + 8;
        type_hash._M_h._M_buckets = (__buckets_ptr)CONCAT44(type_hash._M_h._M_buckets._4_4_,8);
        pOVar52 = pOVar49;
        Write(this);
        WriteData(this,"static const u8 data_segment_data_",0x22);
        pcVar70 = (char *)&type_hash;
        (anonymous_namespace)::CWriter::
        Write<wabt::(anonymous_namespace)::GlobalName,char_const(&)[6],wabt::(anonymous_namespace)::OpenBrace>
                  ((CWriter *)this,(GlobalName *)pcVar70,u_03,pOVar52);
        pbVar13 = *(byte **)(lVar76 + 0x88);
        pbVar14 = *(byte **)(lVar76 + 0x90);
        uVar59 = 1;
        lVar76 = -1;
        pbVar74 = pbVar13;
        while( true ) {
          pNVar56 = (Newline *)0xc;
          pacVar55 = (char (*) [2])(uVar59 % 0xc);
          if (pbVar74 == pbVar14) break;
          pcVar70 = "0x%02x, ";
          Writef(this,"0x%02x, ",(ulong)*pbVar74);
          if ((uVar59 / 0xc) * 0xc + lVar76 == 0) {
            Write(this);
          }
          pbVar74 = pbVar74 + 1;
          lVar76 = lVar76 + -1;
          uVar59 = uVar59 + 1;
        }
        if (pbVar14 != pbVar13) {
          Write(this);
          pacVar55 = extraout_RDX_04;
        }
        (anonymous_namespace)::CWriter::
        Write<wabt::(anonymous_namespace)::CloseBrace,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(CloseBrace *)pcVar70,pacVar55,pNVar56);
      }
    }
    (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
              ((string *)&type_hash,(CWriter *)this);
    Write(this);
    WriteData(this,"static void init_memories(",0x1a);
    (anonymous_namespace)::CWriter::
    Write<std::__cxx11::string,char_const(&)[13],wabt::(anonymous_namespace)::OpenBrace>
              ((CWriter *)this,(string *)&type_hash,(char (*) [13])"* instance) ",pOVar49);
    std::__cxx11::string::_M_dispose();
    pMVar47 = this->module_;
    pNVar56 = (Newline *)
              (pMVar47->memories).
              super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppMVar50 = (pMVar47->memories).
               super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    pCVar71 = (CloseBrace *)((long)pNVar56 - (long)ppMVar50 >> 3);
    pNVar62 = (Newline *)(ulong)pMVar47->num_memory_imports;
    if (pNVar62 < pCVar71) {
      for (; pNVar56 = (Newline *)((long)pNVar56 - (long)ppMVar50 >> 3), pNVar62 < pNVar56;
          pNVar62 = (Newline *)(ulong)((int)pNVar62 + 1)) {
        pMVar15 = ppMVar50[(long)pNVar62];
        IVar37 = 0x10000;
        if ((pMVar15->page_limits).has_max == true) {
          IVar37 = (Index)(pMVar15->page_limits).max;
        }
        type_hash._M_h._M_buckets = (__buckets_ptr)CONCAT44(type_hash._M_h._M_buckets._4_4_,7);
        type_hash._M_h._M_bucket_count = (size_type)pMVar15;
        WriteData(this,"wasm_rt_allocate_memory(",0x18);
        Write(this,(ExternalInstancePtr *)&type_hash);
        WriteData(this,", ",2);
        Write(this,(Index)(pMVar15->page_limits).initial);
        WriteData(this,", ",2);
        Write(this,IVar37);
        WriteData(this,", ",2);
        Write(this,(uint)(pMVar15->page_limits).is_64);
        pCVar71 = (CloseBrace *)0x1675e3;
        (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [3])0x1675e3,u_04);
        pMVar47 = this->module_;
        ppMVar50 = (pMVar47->memories).
                   super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pNVar56 = (Newline *)
                  (pMVar47->memories).
                  super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
    }
    ppDVar16 = (pMVar47->data_segments).
               super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl
               .super__Vector_impl_data._M_finish;
    for (ppDVar63 = (pMVar47->data_segments).
                    super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppDVar63 != ppDVar16;
        ppDVar63 = ppDVar63 + 1) {
      pDVar17 = *ppDVar63;
      if (pDVar17->kind == Active) {
        pMVar47 = this->module_;
        IVar37 = Module::GetMemoryIndex(pMVar47,&pDVar17->memory_var);
        type_hash._M_h._M_bucket_count =
             (size_type)
             (pMVar47->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
             ._M_impl.super__Vector_impl_data._M_start[IVar37];
        type_hash._M_h._M_buckets = (__buckets_ptr)CONCAT44(type_hash._M_h._M_buckets._4_4_,7);
        WriteData(this,"LOAD_DATA(",10);
        Write(this,(ExternalInstanceRef *)&type_hash);
        WriteData(this,", ",2);
        WriteInitExpr(this,&pDVar17->offset);
        puVar18 = (pDVar17->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        puVar19 = (pDVar17->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (puVar18 == puVar19) {
          WriteData(this,", NULL, 0",9);
          pNVar56 = extraout_RDX_06;
        }
        else {
          type_hash._M_h._M_bucket_count = (size_type)&pDVar17->name;
          type_hash._M_h._M_buckets = (__buckets_ptr)CONCAT44(type_hash._M_h._M_buckets._4_4_,8);
          WriteData(this,", data_segment_data_",0x14);
          Write(this,(GlobalName *)&type_hash);
          WriteData(this,", ",2);
          Write(this,(int)puVar19 - (int)puVar18);
          pNVar56 = extraout_RDX_05;
        }
        pCVar71 = (CloseBrace *)0x1675e3;
        (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [3])0x1675e3,pNVar56);
        pNVar56 = extraout_RDX_07;
      }
    }
    (anonymous_namespace)::CWriter::
    Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,pCVar71,pNVar56);
    pMVar47 = this->module_;
    pbVar51 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (pMVar47->data_segments).
              super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pbVar51 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        (pMVar47->data_segments).
        super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
                ((string *)&type_hash,(CWriter *)this);
      pcVar70 = "static void init_data_instances(";
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::Newline,char_const(&)[33],std::__cxx11::string,char_const(&)[13],wabt::(anonymous_namespace)::OpenBrace>
                ((CWriter *)this,(Newline *)"static void init_data_instances(",
                 (char (*) [33])&type_hash,pbVar51,(char (*) [13])in_R8,in_R9);
      std::__cxx11::string::_M_dispose();
      ppDVar16 = (this->module_->data_segments).
                 super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      pNVar56 = extraout_RDX_08;
      for (ppDVar63 = (this->module_->data_segments).
                      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; ppDVar63 != ppDVar16;
          ppDVar63 = ppDVar63 + 1) {
        pDVar17 = *ppDVar63;
        if ((pDVar17->kind == Passive) &&
           (args = (char (*) [10])
                   (pDVar17->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_start,
           args != (char (*) [10])
                   (pDVar17->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_finish)) {
          type_hash._M_h._M_bucket_count = (size_type)&pDVar17->name;
          type_hash._M_h._M_buckets = (__buckets_ptr)CONCAT44(type_hash._M_h._M_buckets._4_4_,8);
          pcVar70 = "instance->data_segment_dropped_";
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[32],wabt::(anonymous_namespace)::GlobalName,char_const(&)[10],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,(char (*) [32])"instance->data_segment_dropped_",
                     (GlobalName *)&type_hash,args,(Newline *)in_R8);
          pNVar56 = extraout_RDX_09;
        }
      }
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(CloseBrace *)pcVar70,pNVar56);
      pMVar47 = this->module_;
    }
  }
  if ((pMVar47->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pMVar47->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pOVar12 = (OpenBrace *)
              (pMVar47->elem_segments).
              super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pOVar49 = (OpenBrace *)
                   (pMVar47->elem_segments).
                   super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; pcVar70 = (char *)&type_hash,
        pOVar49 != pOVar12; pOVar49 = pOVar49 + 8) {
      lVar76 = *(long *)pOVar49;
      if ((*(long *)(lVar76 + 0x90) != *(long *)(lVar76 + 0x98)) &&
         (*(int *)(lVar76 + 0x70) != -0x11)) {
        type_hash._M_h._M_bucket_count = lVar76 + 8;
        type_hash._M_h._M_buckets = (__buckets_ptr)CONCAT44(type_hash._M_h._M_buckets._4_4_,6);
        pOVar52 = pOVar49;
        Write(this);
        WriteData(this,"static const wasm_elem_segment_expr_t elem_segment_exprs_",0x39);
        (anonymous_namespace)::CWriter::
        Write<wabt::(anonymous_namespace)::GlobalName,char_const(&)[6],wabt::(anonymous_namespace)::OpenBrace>
                  ((CWriter *)this,(GlobalName *)pcVar70,u_05,pOVar52);
        piVar20 = *(intrusive_list<wabt::Expr> **)(lVar76 + 0x98);
        pacVar55 = extraout_RDX_10;
        for (this_01 = *(intrusive_list<wabt::Expr> **)(lVar76 + 0x90); this_01 != piVar20;
            this_01 = this_01 + 1) {
          if (this_01->size_ != 1) {
            __assert_fail("elem_expr.size() == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                          ,0x727,
                          "void wabt::(anonymous namespace)::CWriter::WriteElemInitializers()");
          }
          base_00 = intrusive_list<wabt::Expr>::front(this_01);
          EVar3 = base_00->type_;
          pOVar52 = (OpenBrace *)(ulong)EVar3;
          if (EVar3 == RefNull) {
            pcVar70 = "{NULL, NULL, 0},";
            (anonymous_namespace)::CWriter::
            Write<char_const(&)[17],wabt::(anonymous_namespace)::Newline>
                      ((CWriter *)this,(char (*) [17])"{NULL, NULL, 0},",u_06);
            pacVar55 = extraout_RDX_12;
          }
          else {
            if (EVar3 != RefFunc) goto LAB_0013c181;
            pMVar47 = this->module_;
            pVVar41 = cast<wabt::VarExpr<(wabt::ExprType)36>,wabt::Expr>(base_00);
            pFVar42 = Module::GetFunc(pMVar47,&pVVar41->var);
            serialized_type._M_dataplus._M_p =
                 (pointer)Module::GetFuncType(this->module_,&(pFVar42->decl).type_var);
            type_hash._M_h._M_buckets =
                 (__buckets_ptr)((ulong)type_hash._M_h._M_buckets & 0xffffffff00000000);
            type_hash._M_h._M_bucket_count = (size_type)pFVar42;
            WriteData(this,"{",1);
            Write(this,(FuncTypeExpr *)&serialized_type);
            WriteData(this,", (wasm_rt_function_ptr_t)",0x1a);
            Write(this,(ExternalPtr *)&type_hash);
            WriteData(this,", ",2);
            sVar43 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::count(&this->import_module_sym_map_,&pFVar42->name);
            if (sVar43 == 0) {
              WriteData(this,"0",1);
              pNVar56 = extraout_RDX_13;
            }
            else {
              (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
                        ((string *)&type_hash,(CWriter *)this);
              serialized_type._M_string_length =
                   (size_type)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&this->import_module_sym_map_,&pFVar42->name);
              serialized_type._M_dataplus._M_p._0_4_ = 2;
              WriteData(this,"offsetof(",9);
              WriteData(this,(char *)type_hash._M_h._M_buckets,type_hash._M_h._M_bucket_count);
              (anonymous_namespace)::CWriter::
              Write<char_const(&)[3],wabt::(anonymous_namespace)::GlobalName,char_const(&)[2]>
                        ((CWriter *)this,(char (*) [3])0x167625,(GlobalName *)&serialized_type,
                         (char (*) [2])pOVar52);
              std::__cxx11::string::_M_dispose();
              pNVar56 = extraout_RDX_11;
            }
            pcVar70 = "},";
            (anonymous_namespace)::CWriter::
            Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                      ((CWriter *)this,(char (*) [3])0x163ff9,pNVar56);
            pacVar55 = extraout_RDX_14;
          }
        }
        (anonymous_namespace)::CWriter::
        Write<wabt::(anonymous_namespace)::CloseBrace,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(CloseBrace *)pcVar70,pacVar55,(Newline *)pOVar52);
      }
    }
    (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
              ((string *)&type_hash,(CWriter *)this);
    Write(this);
    WriteData(this,"static void init_tables(",0x18);
    (anonymous_namespace)::CWriter::
    Write<std::__cxx11::string,char_const(&)[13],wabt::(anonymous_namespace)::OpenBrace>
              ((CWriter *)this,(string *)&type_hash,(char (*) [13])"* instance) ",pOVar49);
    std::__cxx11::string::_M_dispose();
    pMVar47 = this->module_;
    pNVar56 = (Newline *)
              (pMVar47->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppTVar53 = (pMVar47->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    pCVar71 = (CloseBrace *)((long)pNVar56 - (long)ppTVar53 >> 3);
    pNVar62 = (Newline *)(ulong)pMVar47->num_table_imports;
    if (pNVar62 < pCVar71) {
      for (; pNVar56 = (Newline *)((long)pNVar56 - (long)ppTVar53 >> 3), pNVar62 < pNVar56;
          pNVar62 = (Newline *)(ulong)((int)pNVar62 + 1)) {
        pTVar44 = ppTVar53[(long)pNVar62];
        IVar37 = 0xffffffff;
        if ((pTVar44->elem_limits).has_max == true) {
          IVar37 = (Index)(pTVar44->elem_limits).max;
        }
        pcVar70 = GetReferenceTypeName(&pTVar44->elem_type);
        type_hash._M_h._M_buckets = (__buckets_ptr)CONCAT44(type_hash._M_h._M_buckets._4_4_,5);
        type_hash._M_h._M_bucket_count = (size_type)pTVar44;
        WriteData(this,"wasm_rt_allocate_",0x11);
        sVar38 = strlen(pcVar70);
        WriteData(this,pcVar70,sVar38);
        WriteData(this,"_table(",7);
        Write(this,(ExternalInstancePtr *)&type_hash);
        WriteData(this,", ",2);
        Write(this,(Index)(pTVar44->elem_limits).initial);
        WriteData(this,", ",2);
        Write(this,IVar37);
        pCVar71 = (CloseBrace *)0x1675e3;
        (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [3])0x1675e3,u_07);
        pMVar47 = this->module_;
        ppTVar53 = (pMVar47->tables).
                   super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pNVar56 = (Newline *)
                  (pMVar47->tables).
                  super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
    }
    ppEVar21 = (pMVar47->elem_segments).
               super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl
               .super__Vector_impl_data._M_finish;
    for (ppEVar64 = (pMVar47->elem_segments).
                    super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppEVar64 != ppEVar21;
        ppEVar64 = ppEVar64 + 1) {
      pEVar22 = *ppEVar64;
      if (pEVar22->kind == Active) {
        pTVar44 = Module::GetTable(this->module_,&pEVar22->table_var);
        pCVar71 = (CloseBrace *)0x1;
        WriteElemTableInit(this,true,pEVar22,pTVar44);
        pNVar56 = extraout_RDX_15;
      }
    }
    (anonymous_namespace)::CWriter::
    Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,pCVar71,pNVar56);
    pMVar47 = this->module_;
    pbVar51 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (pMVar47->elem_segments).
              super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pbVar51 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        (pMVar47->elem_segments).
        super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
                ((string *)&type_hash,(CWriter *)this);
      pcVar70 = "static void init_elem_instances(";
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::Newline,char_const(&)[33],std::__cxx11::string,char_const(&)[13],wabt::(anonymous_namespace)::OpenBrace>
                ((CWriter *)this,(Newline *)"static void init_elem_instances(",
                 (char (*) [33])&type_hash,pbVar51,(char (*) [13])in_R8,in_R9);
      std::__cxx11::string::_M_dispose();
      ppEVar21 = (this->module_->elem_segments).
                 super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      pNVar56 = extraout_RDX_16;
      for (ppEVar64 = (this->module_->elem_segments).
                      super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; ppEVar64 != ppEVar21;
          ppEVar64 = ppEVar64 + 1) {
        pEVar22 = *ppEVar64;
        if ((pEVar22->kind == Passive) &&
           (args_00 = (pEVar22->elem_exprs).
                      super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
           args_00 !=
           (pEVar22->elem_exprs).
           super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)) {
          type_hash._M_h._M_bucket_count = (size_type)&pEVar22->name;
          type_hash._M_h._M_buckets = (__buckets_ptr)CONCAT44(type_hash._M_h._M_buckets._4_4_,6);
          pcVar70 = "instance->elem_segment_dropped_";
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[32],wabt::(anonymous_namespace)::GlobalName,char_const(&)[10],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,(char (*) [32])0x164153,(GlobalName *)&type_hash,
                     (char (*) [10])args_00,(Newline *)in_R8);
          pNVar56 = extraout_RDX_17;
        }
      }
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(CloseBrace *)pcVar70,pNVar56);
      pMVar47 = this->module_;
    }
  }
  pcVar70 = (char *)(pMVar47->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  pacVar23 = (char (*) [3])
             (pMVar47->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  uVar68 = 0;
  do {
    if ((char (*) [3])pcVar70 == pacVar23) {
      WriteExports(this,Definitions);
      if ((this->import_module_set_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
                  ((string *)&type_hash,(CWriter *)this);
        Write(this);
        WriteData(this,"static void init_instance_import(",0x21);
        (anonymous_namespace)::CWriter::Write<std::__cxx11::string,char_const(&)[11]>
                  ((CWriter *)this,(string *)&type_hash,u_16);
        std::__cxx11::string::_M_dispose();
        auVar81._8_8_ = extraout_RDX_27;
        auVar81._0_8_ =
             (this->import_module_set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while( true ) {
          p_Var75 = auVar81._0_8_;
          if ((_Rb_tree_header *)p_Var75 ==
              &(this->import_module_set_)._M_t._M_impl.super__Rb_tree_header) break;
          module_name._M_str = pcVar70;
          module_name._M_len = *(size_t *)(p_Var75 + 1);
          (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
                    ((string *)&type_hash,(CWriter *)p_Var75[1]._M_parent,module_name);
          serialized_type._M_dataplus._M_p._0_4_ = 2;
          serialized_type._M_string_length = (size_type)(p_Var75 + 1);
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[10],std::__cxx11::string,char_const(&)[3],wabt::(anonymous_namespace)::GlobalName>
                    ((CWriter *)this,(char (*) [10])&type_hash,&serialized_type,
                     (char (*) [3])pcVar70,in_R8);
          std::__cxx11::string::_M_dispose();
          auVar81 = std::_Rb_tree_increment(p_Var75);
        }
        psVar72 = (string *)0x163657;
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[2],wabt::(anonymous_namespace)::OpenBrace>
                  ((CWriter *)this,(char (*) [2])0x163657,auVar81._8_8_);
        auVar82._8_8_ = extraout_RDX_28;
        auVar82._0_8_ =
             (this->import_func_module_set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while( true ) {
          pNVar56 = auVar82._8_8_;
          p_Var75 = auVar82._0_8_;
          if ((_Rb_tree_header *)p_Var75 ==
              &(this->import_func_module_set_)._M_t._M_impl.super__Rb_tree_header) break;
          type_hash._M_h._M_bucket_count = (size_type)(p_Var75 + 1);
          type_hash._M_h._M_buckets = (__buckets_ptr)CONCAT44(type_hash._M_h._M_buckets._4_4_,2);
          serialized_type._M_dataplus._M_p._0_4_ = 2;
          serialized_type._M_string_length = type_hash._M_h._M_bucket_count;
          WriteData(this,"instance->",10);
          Write(this,(GlobalName *)&type_hash);
          WriteData(this," = ",3);
          psVar72 = &serialized_type;
          Write(this,(GlobalName *)&serialized_type);
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,(char (*) [2])psVar72,u_17);
          auVar82 = std::_Rb_tree_increment(p_Var75);
        }
        ppIVar27 = (this->unique_imports_).
                   super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        for (ppIVar65 = (this->unique_imports_).
                        super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppIVar65 != ppIVar27;
            ppIVar65 = ppIVar65 + 1) {
          pIVar28 = *ppIVar65;
          EVar5 = pIVar28->kind_;
          pcVar70 = (char *)(ulong)(EVar5 - Table);
          if (EVar5 - Table < 3) {
            module_name_00._M_str = (char *)(pIVar28->field_name)._M_string_length;
            module_name_00._M_len = (size_t)(pIVar28->module_name)._M_dataplus._M_p;
            export_name._M_str = (char *)in_R9;
            export_name._M_len = (size_t)(pIVar28->field_name)._M_dataplus._M_p;
            (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
                      ((string *)&type_hash,(CWriter *)(pIVar28->module_name)._M_string_length,
                       module_name_00,export_name);
            in_R8 = (GlobalName *)(pIVar28->field_name)._M_dataplus._M_p;
            pcVar70 = (char *)(pIVar28->field_name)._M_string_length;
            module_name_01._M_str = pcVar70;
            module_name_01._M_len = (size_t)(pIVar28->module_name)._M_dataplus._M_p;
            export_name_00._M_str = (char *)in_R9;
            export_name_00._M_len = (size_t)in_R8;
            (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
                      (&serialized_type,(CWriter *)(pIVar28->module_name)._M_string_length,
                       module_name_01,export_name_00);
            name._M_dataplus._M_p._0_4_ = 2;
            name._M_string_length = (size_type)&pIVar28->module_name;
            WriteData(this,"instance->",10);
            WriteData(this,(char *)type_hash._M_h._M_buckets,type_hash._M_h._M_bucket_count);
            WriteData(this," = ",3);
            WriteData(this,serialized_type._M_dataplus._M_p,serialized_type._M_string_length);
            WriteData(this,"(",1);
            Write(this,(GlobalName *)&name);
            psVar72 = (string *)0x1675e3;
            (anonymous_namespace)::CWriter::
            Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                      ((CWriter *)this,(char (*) [3])0x1675e3,u_18);
            std::__cxx11::string::_M_dispose();
            std::__cxx11::string::_M_dispose();
            pNVar56 = extraout_RDX_29;
          }
          else if ((EVar5 != First) && (EVar5 != Last)) {
LAB_0013c181:
            abort();
          }
        }
        (anonymous_namespace)::CWriter::
        Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(CloseBrace *)psVar72,pNVar56);
      }
      WriteImportProperties(this,Definitions);
      (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
                ((string *)&type_hash,(CWriter *)this);
      Write(this);
      WriteData(this,"void ",5);
      WriteData(this,"wasm2c_",7);
      WriteData(this,(this->module_prefix_)._M_dataplus._M_p,(this->module_prefix_)._M_string_length
               );
      WriteData(this,"_instantiate(",0xd);
      WriteData(this,(char *)type_hash._M_h._M_buckets,type_hash._M_h._M_bucket_count);
      pcVar45 = "* instance";
      WriteData(this,"* instance",10);
      std::__cxx11::string::_M_dispose();
      auVar83._8_8_ = extraout_RDX_30;
      auVar83._0_8_ =
           (this->import_module_set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var2 = &(this->import_module_set_)._M_t._M_impl.super__Rb_tree_header;
      while( true ) {
        p_Var75 = auVar83._0_8_;
        if ((_Rb_tree_header *)p_Var75 == p_Var2) break;
        module_name_02._M_str = pcVar70;
        module_name_02._M_len = *(size_t *)(p_Var75 + 1);
        (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
                  ((string *)&type_hash,(CWriter *)p_Var75[1]._M_parent,module_name_02);
        serialized_type._M_dataplus._M_p._0_4_ = 2;
        pcVar45 = (char *)&type_hash;
        serialized_type._M_string_length = (size_type)(p_Var75 + 1);
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[10],std::__cxx11::string,char_const(&)[3],wabt::(anonymous_namespace)::GlobalName>
                  ((CWriter *)this,(char (*) [10])&type_hash,&serialized_type,(char (*) [3])pcVar70,
                   in_R8);
        std::__cxx11::string::_M_dispose();
        auVar83 = std::_Rb_tree_increment(p_Var75);
      }
      (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::OpenBrace>
                ((CWriter *)this,(char (*) [3])pcVar45,auVar83._8_8_);
      pcVar70 = "assert(wasm_rt_is_initialized());";
      (anonymous_namespace)::CWriter::Write<char_const(&)[34],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(char (*) [34])"assert(wasm_rt_is_initialized());",u_19);
      pNVar56 = extraout_RDX_31;
      if ((this->import_module_set_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        WriteData(this,"init_instance_import(instance",0x1d);
        auVar84._8_8_ = extraout_RDX_32;
        auVar84._0_8_ =
             (this->import_module_set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while( true ) {
          p_Var75 = auVar84._0_8_;
          if ((_Rb_tree_header *)p_Var75 == p_Var2) break;
          type_hash._M_h._M_bucket_count = (size_type)(p_Var75 + 1);
          type_hash._M_h._M_buckets = (__buckets_ptr)CONCAT44(type_hash._M_h._M_buckets._4_4_,2);
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[3],wabt::(anonymous_namespace)::GlobalName>
                    ((CWriter *)this,(char (*) [3])0x167625,(GlobalName *)&type_hash);
          auVar84 = std::_Rb_tree_increment(p_Var75);
        }
        pcVar70 = ");";
        (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [3])0x1675e3,auVar84._8_8_);
        pNVar56 = extraout_RDX_33;
      }
      pMVar47 = this->module_;
      if ((pMVar47->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (pMVar47->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pcVar70 = "init_globals(instance);";
        WriteData(this,"init_globals(instance);",0x17);
        Write(this);
        pMVar47 = this->module_;
        pNVar56 = extraout_RDX_34;
      }
      if ((pMVar47->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (pMVar47->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pcVar70 = "init_memories(instance);";
        WriteData(this,"init_memories(instance);",0x18);
        Write(this);
        pMVar47 = this->module_;
        pNVar56 = extraout_RDX_35;
      }
      if ((pMVar47->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (pMVar47->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pcVar70 = "init_tables(instance);";
        WriteData(this,"init_tables(instance);",0x16);
        Write(this);
        pMVar47 = this->module_;
        pNVar56 = extraout_RDX_36;
      }
      if (((pMVar47->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
           _M_impl.super__Vector_impl_data._M_start !=
           (pMVar47->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
           _M_impl.super__Vector_impl_data._M_finish) &&
         ((pMVar47->data_segments).
          super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pMVar47->data_segments).
          super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        pcVar70 = "init_data_instances(instance);";
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[31],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [31])"init_data_instances(instance);",pNVar56);
        pMVar47 = this->module_;
        pNVar56 = extraout_RDX_37;
      }
      if (((pMVar47->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
           _M_impl.super__Vector_impl_data._M_start !=
           (pMVar47->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
           _M_impl.super__Vector_impl_data._M_finish) &&
         ((pMVar47->elem_segments).
          super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pMVar47->elem_segments).
          super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        pcVar70 = "init_elem_instances(instance);";
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[31],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [31])"init_elem_instances(instance);",pNVar56);
        pMVar47 = this->module_;
        pNVar56 = extraout_RDX_38;
      }
      ppVVar29 = (pMVar47->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      for (ppVVar66 = (pMVar47->starts).
                      super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>._M_impl.
                      super__Vector_impl_data._M_start; ppVVar66 != ppVVar29;
          ppVVar66 = ppVVar66 + 1) {
        var = *ppVVar66;
        type_hash._M_h._M_bucket_count = (size_type)Module::GetFunc(this->module_,var);
        type_hash._M_h._M_buckets =
             (__buckets_ptr)((ulong)type_hash._M_h._M_buckets & 0xffffffff00000000);
        Write(this,(ExternalRef *)&type_hash);
        pFVar42 = Module::GetFunc(this->module_,var);
        sVar43 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::count(&this->import_module_sym_map_,&pFVar42->name);
        if (sVar43 == 0) {
          pcVar70 = "(instance);";
          sStack_150 = 0xb;
        }
        else {
          pFVar42 = Module::GetFunc(this->module_,var);
          type_hash._M_h._M_bucket_count =
               (size_type)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->import_module_sym_map_,&pFVar42->name);
          type_hash._M_h._M_buckets = (__buckets_ptr)CONCAT44(type_hash._M_h._M_buckets._4_4_,2);
          WriteData(this,"(instance->",0xb);
          Write(this,(GlobalName *)&type_hash);
          pcVar70 = ");";
          sStack_150 = 2;
        }
        WriteData(this,pcVar70,sStack_150);
        Write(this);
        pNVar56 = extraout_RDX_39;
      }
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(CloseBrace *)pcVar70,pNVar56);
      (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
                ((string *)&type_hash,(CWriter *)this);
      Write(this);
      WriteData(this,"void ",5);
      WriteData(this,"wasm2c_",7);
      WriteData(this,(this->module_prefix_)._M_dataplus._M_p,(this->module_prefix_)._M_string_length
               );
      WriteData(this,"_free(",6);
      WriteData(this,(char *)type_hash._M_h._M_buckets,type_hash._M_h._M_bucket_count);
      pcVar70 = "* instance) ";
      WriteData(this,"* instance) ",0xc);
      Write(this);
      std::__cxx11::string::_M_dispose();
      pMVar47 = this->module_;
      ppTVar30 = (pMVar47->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      uVar68 = 0;
      pNVar56 = extraout_RDX_40;
      for (ppTVar53 = (pMVar47->tables).
                      super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                      super__Vector_impl_data._M_start; ppTVar53 != ppTVar30;
          ppTVar53 = ppTVar53 + 1) {
        if (pMVar47->num_table_imports <= uVar68) {
          pTVar44 = *ppTVar53;
          pcVar70 = GetReferenceTypeName(&pTVar44->elem_type);
          type_hash._M_h._M_buckets = (__buckets_ptr)CONCAT44(type_hash._M_h._M_buckets._4_4_,5);
          type_hash._M_h._M_bucket_count = (size_type)pTVar44;
          WriteData(this,"wasm_rt_free_",0xd);
          sVar38 = strlen(pcVar70);
          WriteData(this,pcVar70,sVar38);
          WriteData(this,"_table(",7);
          Write(this,(ExternalInstancePtr *)&type_hash);
          pcVar70 = ");";
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,(char (*) [3])0x1675e3,u_20);
          pMVar47 = this->module_;
          pNVar56 = extraout_RDX_41;
        }
        uVar68 = uVar68 + 1;
      }
      ppMVar31 = (pMVar47->memories).
                 super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      uVar68 = 0;
      for (ppMVar50 = (pMVar47->memories).
                      super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                      super__Vector_impl_data._M_start; ppMVar50 != ppMVar31;
          ppMVar50 = ppMVar50 + 1) {
        if (this->module_->num_memory_imports <= uVar68) {
          type_hash._M_h._M_bucket_count = (size_type)*ppMVar50;
          type_hash._M_h._M_buckets = (__buckets_ptr)CONCAT44(type_hash._M_h._M_buckets._4_4_,7);
          WriteData(this,"wasm_rt_free_memory(",0x14);
          Write(this,(ExternalInstancePtr *)&type_hash);
          pcVar70 = ");";
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,(char (*) [3])0x1675e3,u_21);
          pNVar56 = extraout_RDX_42;
        }
        uVar68 = uVar68 + 1;
      }
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(CloseBrace *)pcVar70,pNVar56);
      Write(this);
      WriteData(this,"wasm_rt_func_type_t ",0x14);
      WriteData(this,"wasm2c_",7);
      WriteData(this,(this->module_prefix_)._M_dataplus._M_p,(this->module_prefix_)._M_string_length
               );
      WriteData(this,"_get_func_type(uint32_t param_count, uint32_t result_count, ...) ",0x41);
      Write(this);
      (anonymous_namespace)::CWriter::Write<char_const(&)[14],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(char (*) [14])"va_list args;",u_22);
      ppTVar6 = (this->module_->types).
                super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppTVar58 = (this->module_->types).
                      super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; ppTVar58 != ppTVar6;
          ppTVar58 = ppTVar58 + 1) {
        pFVar39 = cast<wabt::FuncType,wabt::TypeEntry>(*ppTVar58);
        pTVar67 = (pFVar39->sig).param_types.
                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pTVar24 = (pFVar39->sig).result_types.
                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pTVar32 = (pFVar39->sig).param_types.
                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pTVar33 = (pFVar39->sig).result_types.
                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                  super__Vector_impl_data._M_start;
        Write(this);
        WriteData(this,"if (param_count == ",0x13);
        Write(this,(Index)((ulong)((long)pTVar67 - (long)pTVar32) >> 3));
        WriteData(this," && result_count == ",0x14);
        Write(this,(Index)((ulong)((long)pTVar24 - (long)pTVar33) >> 3));
        WriteData(this,") ",2);
        Write(this);
        WriteData(this,"va_start(args, result_count);",0x1d);
        Write(this);
        pcVar70 = "if (true";
        WriteData(this,"if (true",8);
        pTVar24 = (pFVar39->sig).param_types.
                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pOVar49 = extraout_RDX_43;
        for (pTVar67 = (pFVar39->sig).param_types.
                       super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                       super__Vector_impl_data._M_start; pTVar67 != pTVar24; pTVar67 = pTVar67 + 1)
        {
          type_hash._M_h._M_buckets = *(__buckets_ptr *)pTVar67;
          pcVar70 = (char *)&type_hash;
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[37],wabt::(anonymous_namespace)::TypeEnum>
                    ((CWriter *)this,(char (*) [37])&type_hash,(TypeEnum *)pOVar49);
          pOVar49 = extraout_RDX_44;
        }
        pTVar24 = (pFVar39->sig).result_types.
                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (pTVar67 = (pFVar39->sig).result_types.
                       super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                       super__Vector_impl_data._M_start; pTVar67 != pTVar24; pTVar67 = pTVar67 + 1)
        {
          type_hash._M_h._M_buckets = *(__buckets_ptr *)pTVar67;
          pcVar70 = (char *)&type_hash;
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[37],wabt::(anonymous_namespace)::TypeEnum>
                    ((CWriter *)this,(char (*) [37])&type_hash,(TypeEnum *)pOVar49);
          pOVar49 = extraout_RDX_45;
        }
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[3],wabt::(anonymous_namespace)::OpenBrace>
                  ((CWriter *)this,(char (*) [3])pcVar70,pOVar49);
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[14],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [14])"va_end(args);",u_23);
        type_hash._M_h._M_buckets = (__buckets_ptr)pFVar39;
        WriteData(this,"return ",7);
        pCVar71 = (CloseBrace *)&type_hash;
        Write(this,(FuncTypeExpr *)&type_hash);
        (anonymous_namespace)::CWriter::Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [2])pCVar71,u_24);
        (anonymous_namespace)::CWriter::
        Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,pCVar71,u_25);
        pcVar70 = "va_end(args);";
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[14],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [14])"va_end(args);",u_26);
        (anonymous_namespace)::CWriter::
        Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(CloseBrace *)pcVar70,u_27);
      }
      Write(this);
      pcVar70 = "return NULL;";
      WriteData(this,"return NULL;",0xc);
      Write(this);
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(CloseBrace *)pcVar70,u_28);
      return;
    }
    if (this->module_->num_func_imports <= uVar68) {
      pFVar42 = *(Func **)pcVar70;
      Write(this);
      this->func_ = pFVar42;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&(this->local_syms_)._M_t,&(this->global_syms_)._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::clear(&(this->local_sym_map_)._M_t);
      std::
      _Rb_tree<std::pair<unsigned_int,_wabt::Type>,_std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<unsigned_int,_wabt::Type>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::clear(&(this->stack_var_sym_map_)._M_t);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>_>_>
      ::clear(&this->func_sections_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&(this->func_includes_)._M_t);
      pTVar54 = &(pFVar42->decl).sig.result_types;
      type_hash._M_h._M_buckets =
           (__buckets_ptr)((ulong)type_hash._M_h._M_buckets & 0xffffffff00000000);
      type_hash._M_h._M_bucket_count = (size_type)pFVar42;
      serialized_type._M_dataplus._M_p = (pointer)pTVar54;
      WriteData(this,"static ",7);
      Write(this,(ResultType *)&serialized_type);
      WriteData(this," ",1);
      Write(this,(GlobalName *)&type_hash);
      WriteData(this,"(",1);
      serialized_type._M_dataplus._M_p = (pointer)0x0;
      serialized_type._M_string_length = 0;
      serialized_type.field_2._M_allocated_capacity = 0;
      IVar37 = Func::GetNumParamsAndLocals(this->func_);
      MakeTypeBindingReverseMapping
                ((ulong)IVar37,&this->func_->bindings,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&serialized_type);
      WriteParams(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&serialized_type);
      (anonymous_namespace)::CWriter::Write<char_const(&)[2],wabt::(anonymous_namespace)::OpenBrace>
                ((CWriter *)this,(char (*) [2])0x161603,u_08);
      pTVar67 = (this->func_->decl).sig.param_types.
                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pTVar24 = (this->func_->decl).sig.param_types.
                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                super__Vector_impl_data._M_start;
      pacVar55 = extraout_RDX_18;
      for (lVar76 = 0; lVar76 != 0x1c; lVar76 = lVar76 + 4) {
        EVar4 = *(Enum *)((long)&DAT_0016310c + lVar76);
        name._M_dataplus._M_p._4_4_ = 0xffffffff;
        ppVar78 = (this->func_->local_types).decls_.
                  super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar25 = (this->func_->local_types).decls_.
                  super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        uVar57 = 0;
        uVar59 = (ulong)((long)pTVar67 - (long)pTVar24) >> 3 & 0xffffffff;
        uVar77 = 0;
        name._M_dataplus._M_p._0_4_ = EVar4;
        while ((ppVar78 != ppVar25 || (uVar57 != 0))) {
          local_type = ppVar78->first;
          if (EVar4 == local_type.enum_) {
            if (uVar77 == 0) {
              (anonymous_namespace)::CWriter::Write<wabt::Type&,char_const(&)[2]>
                        ((CWriter *)this,(Type *)&name,pacVar55);
              this->indent_ = this->indent_ + 4;
            }
            else {
              WriteData(this,", ",2);
              if ((uVar77 & 7) == 0) {
                Write(this);
              }
            }
            name_03._M_str = *(char **)(serialized_type._M_dataplus._M_p + uVar59 * 0x20);
            name_03._M_len = *(size_t *)(serialized_type._M_dataplus._M_p + uVar59 * 0x20 + 8);
            (anonymous_namespace)::CWriter::DefineParamName_abi_cxx11_
                      ((string *)&type_hash,(CWriter *)this,name_03);
            WriteData(this,(char *)type_hash._M_h._M_buckets,type_hash._M_h._M_bucket_count);
            WriteData(this," = ",3);
            std::__cxx11::string::_M_dispose();
            if ((uint)(EVar4 + 0x11) < 2) {
              pcVar45 = GetReferenceNullValue(&local_type);
              sStack_150 = strlen(pcVar45);
            }
            else if (EVar4 == V128) {
              pcVar45 = "simde_wasm_i64x2_make(0, 0)";
              sStack_150 = 0x1b;
            }
            else {
              pcVar45 = "0";
              sStack_150 = 1;
            }
            WriteData(this,pcVar45,sStack_150);
            uVar77 = uVar77 + 1;
            pacVar55 = extraout_RDX_19;
          }
          uVar57 = uVar57 + 1;
          bVar79 = ppVar78->second <= uVar57;
          if (bVar79) {
            ppVar78 = ppVar78 + 1;
          }
          if (bVar79) {
            uVar57 = 0;
          }
          uVar59 = (ulong)((int)uVar59 + 1);
        }
        if (uVar77 != 0) {
          pacVar55 = (char (*) [2])0x4;
          Dedent(this,4);
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,pacVar55,u_09);
          pacVar55 = extraout_RDX_20;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&serialized_type);
      (anonymous_namespace)::CWriter::Write<char_const(&)[15],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(char (*) [15])"FUNC_PROLOGUE;",u_10);
      PushFuncSection(this,(string_view)(ZEXT816(0x161801) << 0x40));
      name_04._M_str = "$Bfunc";
      name_04._M_len = 6;
      (anonymous_namespace)::CWriter::DefineLabelName_abi_cxx11_
                ((string *)&type_hash,(CWriter *)this,name_04);
      ResetTypeStack(this,0);
      serialized_type._M_dataplus._M_p = (pointer)&serialized_type.field_2;
      serialized_type._M_string_length = 0;
      serialized_type.field_2._M_allocated_capacity =
           serialized_type.field_2._M_allocated_capacity & 0xffffffffffffff00;
      PushLabel(this,First,&serialized_type,&(pFVar42->decl).sig,SUB81(in_R8,0));
      std::__cxx11::string::string((string *)&name,(string *)&type_hash);
      (anonymous_namespace)::CWriter::
      Write<wabt::intrusive_list<wabt::Expr>const&,wabt::(anonymous_namespace)::LabelDecl>
                ((CWriter *)this,&pFVar42->exprs,(LabelDecl *)&name);
      std::__cxx11::string::_M_dispose();
      ppLVar1 = &(this->label_stack_).
                 super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppLVar1 = *ppLVar1 + -1;
      ResetTypeStack(this,0);
      PushTypes(this,pTVar54);
      (anonymous_namespace)::CWriter::Write<char_const(&)[15],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(char (*) [15])"FUNC_EPILOGUE;",u_11);
      uVar59 = (ulong)((long)(pFVar42->decl).sig.result_types.
                             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(pFVar42->decl).sig.result_types.
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 3;
      iVar69 = (int)uVar59;
      pacVar55 = extraout_RDX_21;
      if (iVar69 != 0) {
        if (iVar69 == 1) {
          name._M_dataplus._M_p._0_4_ = 0;
          name._M_dataplus._M_p._4_4_ = 0;
          name._M_string_length._0_4_ = 0xffffffff;
          WriteData(this,"return ",7);
          psVar72 = &name;
          Write(this,(StackVar *)psVar72);
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,(char (*) [2])psVar72,u_12);
          pacVar55 = extraout_RDX_22;
        }
        else {
          Write(this);
          name._M_dataplus._M_p = (pointer)pTVar54;
          Write(this,(ResultType *)&name);
          WriteData(this," tmp;",5);
          Write(this);
          pNVar56 = extraout_RDX_23;
          for (uVar77 = 0; iVar69 = iVar69 + -1, (uVar59 & 0xffffffff) != uVar77;
              uVar77 = uVar77 + 1) {
            bVar36 = MangleType((pTVar54->
                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl
                                .super__Vector_impl_data._M_start[uVar77]);
            pNVar56 = (Newline *)(uVar77 & 0xffffffff);
            Writef(this,"tmp.%c%d = ",(ulong)bVar36);
            name._M_dataplus._M_p._4_4_ = 0;
            name._M_string_length._0_4_ = 0xffffffff;
            name._M_dataplus._M_p._0_4_ = iVar69;
            (anonymous_namespace)::CWriter::
            Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                      ((CWriter *)this,(StackVar *)&name,u_13,pNVar56);
            pNVar56 = extraout_RDX_24;
          }
          pcVar45 = "return tmp;";
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[12],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,(char (*) [12])"return tmp;",pNVar56);
          (anonymous_namespace)::CWriter::
          Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,(CloseBrace *)pcVar45,u_14);
          pacVar55 = extraout_RDX_25;
        }
      }
      this->stream_ = this->c_stream_;
      for (lVar76 = 0; lVar76 != 0x1c; lVar76 = lVar76 + 4) {
        iVar69 = *(int *)((long)&DAT_0016310c + lVar76);
        name._M_dataplus._M_p._4_4_ = 0xffffffff;
        auVar80._8_8_ = pacVar55;
        auVar80._0_8_ =
             (this->stack_var_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        uVar59 = 0;
        name._M_dataplus._M_p._0_4_ = iVar69;
        while( true ) {
          pacVar55 = auVar80._8_8_;
          p_Var75 = auVar80._0_8_;
          if ((_Rb_tree_header *)p_Var75 ==
              &(this->stack_var_sym_map_)._M_t._M_impl.super__Rb_tree_header) break;
          if (iVar69 == *(int *)&p_Var75[1].field_0x4) {
            if (uVar59 == 0) {
              (anonymous_namespace)::CWriter::Write<wabt::Type&,char_const(&)[2]>
                        ((CWriter *)this,(Type *)&name,pacVar55);
              this->indent_ = this->indent_ + 4;
            }
            else {
              WriteData(this,", ",2);
              if ((uVar59 & 7) == 0) {
                Write(this);
              }
            }
            WriteData(this,(char *)p_Var75[1]._M_left,(size_t)p_Var75[1]._M_right);
            uVar59 = uVar59 + 1;
          }
          auVar80 = std::_Rb_tree_increment(p_Var75);
        }
        if (uVar59 != 0) {
          pacVar55 = (char (*) [2])0x4;
          Dedent(this,4);
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,pacVar55,u_15);
          pacVar55 = extraout_RDX_26;
        }
      }
      ppVar26 = (this->func_sections_).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (__x = (this->func_sections_).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; __x != ppVar26; __x = __x + 1) {
        MemoryStream::ReleaseOutputBuffer(&__x->second);
        if ((__x->first)._M_string_length == 0) {
LAB_0013b6e8:
          in_R8 = (GlobalName *)0x0;
          Stream::WriteData(this->stream_,*(void **)name._M_dataplus._M_p,
                            *(long *)(name._M_dataplus._M_p + 8) -
                            (long)*(void **)name._M_dataplus._M_p,(char *)0x0,No);
        }
        else {
          sVar46 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::count(&this->func_includes_,&__x->first);
          if (sVar46 != 0) goto LAB_0013b6e8;
        }
        std::unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>::~unique_ptr
                  ((unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_> *)&name
                  );
      }
      Write(this);
      this->func_ = (Func *)0x0;
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      Write(this);
    }
    uVar68 = uVar68 + 1;
    pcVar70 = pcVar70 + 8;
  } while( true );
}

Assistant:

void CWriter::WriteCSource() {
  stream_ = c_stream_;
  Write("/* Automatically generated by wasm2c */", Newline());
  WriteSourceTop();
  WriteFuncTypes();
  WriteTagTypes();
  WriteTags();
  WriteFuncDeclarations();
  WriteGlobalInitializers();
  WriteDataInitializers();
  WriteElemInitializers();
  WriteFuncs();
  WriteExports(CWriterPhase::Definitions);
  WriteInitInstanceImport();
  WriteImportProperties(CWriterPhase::Definitions);
  WriteInit();
  WriteFree();
  WriteGetFuncType();
}